

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O1

Own<capnp::ClientHook> __thiscall
capnp::AnyPointer::Reader::getPipelinedCap(Reader *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  ushort uVar1;
  long in_RCX;
  long lVar2;
  Type TVar3;
  PipelineOp *pPVar4;
  Own<capnp::ClientHook> OVar5;
  undefined1 local_88 [40];
  StructReader local_60;
  
  pPVar4 = ops.ptr;
  local_88._0_8_ = *pPVar4;
  local_88._8_8_ = pPVar4[1];
  local_88._16_8_ = pPVar4[2];
  local_88._24_8_ = pPVar4[3];
  if (in_RCX != 0) {
    lVar2 = 0;
    do {
      if (*(int *)(ops.size_ + lVar2) == 1) {
        _::PointerReader::getStruct(&local_60,(PointerReader *)local_88,(word *)0x0);
        uVar1 = *(ushort *)(ops.size_ + 4 + lVar2);
        local_88._8_4_ = NOOP;
        local_88._12_2_ = (anon_union_2_1_ac93b693_for_PipelineOp_2)0x0;
        local_88._14_2_ = 0;
        local_88._16_4_ = NOOP;
        local_88._20_2_ = (anon_union_2_1_ac93b693_for_PipelineOp_2)0x0;
        local_88._22_2_ = 0;
        local_88._0_4_ = NOOP;
        local_88._4_2_ = (anon_union_2_1_ac93b693_for_PipelineOp_2)0x0;
        local_88._6_2_ = 0;
        TVar3 = 0x7fffffff;
        if (uVar1 < local_60.pointerCount) {
          local_88._16_8_ = local_60.pointers + uVar1;
          local_88._8_8_ = local_60.capTable;
          local_88._0_8_ = local_60.segment;
          TVar3 = local_60.nestingLimit;
        }
        local_88._24_4_ = TVar3;
      }
      lVar2 = lVar2 + 8;
    } while (in_RCX << 3 != lVar2);
  }
  OVar5 = _::PointerReader::getCapability(&this->reader);
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<ClientHook> AnyPointer::Reader::getPipelinedCap(
    kj::ArrayPtr<const PipelineOp> ops) const {
  _::PointerReader pointer = reader;

  for (auto& op: ops) {
    switch (op.type) {
      case PipelineOp::Type::NOOP:
        break;

      case PipelineOp::Type::GET_POINTER_FIELD:
        pointer = pointer.getStruct(nullptr).getPointerField(bounded(op.pointerIndex) * POINTERS);
        break;
    }
  }

  return pointer.getCapability();
}